

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O2

void aom_lpf_vertical_6_dual_sse2
               (uint8_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  byte bVar82;
  byte bVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [14];
  undefined1 auVar86 [12];
  unkbyte10 Var87;
  undefined1 auVar88 [14];
  undefined1 auVar89 [12];
  unkbyte10 Var90;
  undefined1 auVar91 [14];
  undefined1 auVar92 [12];
  unkbyte10 Var93;
  undefined1 auVar94 [14];
  undefined1 auVar95 [12];
  unkbyte10 Var96;
  undefined1 auVar97 [12];
  undefined1 auVar98 [12];
  undefined1 auVar99 [15];
  unkuint9 Var100;
  undefined1 auVar101 [11];
  undefined1 auVar102 [15];
  unkuint9 Var103;
  undefined1 auVar104 [11];
  undefined1 auVar105 [15];
  unkuint9 Var106;
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  unkuint9 Var109;
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  unkuint9 Var112;
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [11];
  undefined1 auVar118 [15];
  undefined1 auVar119 [11];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  long lVar132;
  long lVar133;
  long lVar134;
  ushort uVar135;
  undefined4 uVar136;
  ushort uVar150;
  short sVar152;
  ushort uVar154;
  ushort uVar155;
  undefined1 auVar137 [16];
  undefined1 auVar142 [16];
  ushort uVar149;
  ushort uVar153;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined2 uVar156;
  undefined1 uVar170;
  undefined1 uVar172;
  undefined1 uVar174;
  undefined1 uVar176;
  undefined1 uVar178;
  undefined1 auVar161 [16];
  undefined1 auVar168 [16];
  short sVar180;
  undefined1 auVar181 [12];
  undefined1 uVar187;
  undefined1 uVar188;
  undefined1 uVar189;
  undefined1 uVar190;
  undefined1 uVar191;
  undefined1 uVar192;
  short sVar193;
  undefined1 uVar194;
  undefined1 uVar195;
  undefined1 uVar196;
  undefined1 uVar197;
  undefined1 uVar198;
  undefined1 uVar199;
  short sVar200;
  undefined1 uVar201;
  undefined1 uVar202;
  undefined1 uVar203;
  short sVar204;
  short sVar205;
  short sVar206;
  short sVar207;
  undefined1 auVar182 [16];
  short sVar208;
  short sVar209;
  short sVar223;
  short sVar224;
  undefined8 uVar210;
  short sVar225;
  short sVar226;
  short sVar228;
  short sVar229;
  ulong uVar227;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  short sVar230;
  ushort uVar231;
  undefined4 uVar232;
  undefined1 auVar233 [16];
  short sVar257;
  short sVar260;
  short sVar262;
  short sVar263;
  short sVar264;
  short sVar265;
  undefined1 auVar246 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  ushort uVar266;
  ulong uVar267;
  ushort uVar271;
  ushort uVar272;
  short sVar273;
  ushort uVar274;
  ushort uVar275;
  ushort uVar276;
  ushort uVar277;
  undefined1 auVar268 [16];
  ushort uVar278;
  undefined1 auVar279 [16];
  ushort uVar280;
  undefined2 uVar281;
  uint uVar282;
  ushort uVar292;
  ushort uVar293;
  ushort uVar294;
  ushort uVar295;
  ushort uVar296;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  ushort uVar291;
  ushort uVar297;
  undefined1 auVar289 [16];
  byte bVar298;
  byte bVar302;
  byte bVar303;
  byte bVar304;
  byte bVar305;
  byte bVar306;
  byte bVar307;
  byte bVar308;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  ushort uVar309;
  ushort uVar311;
  ushort uVar312;
  ushort uVar313;
  ushort uVar314;
  ushort uVar315;
  ushort uVar316;
  undefined1 auVar310 [16];
  ushort uVar317;
  short sVar319;
  undefined1 auVar318 [16];
  undefined8 uVar320;
  undefined1 auVar321 [16];
  byte bVar330;
  byte bVar335;
  byte bVar337;
  byte bVar339;
  byte bVar341;
  byte bVar343;
  byte bVar345;
  byte bVar347;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  byte bVar349;
  byte bVar351;
  byte bVar352;
  byte bVar353;
  byte bVar354;
  byte bVar355;
  byte bVar356;
  byte bVar357;
  byte bVar358;
  byte bVar359;
  byte bVar360;
  byte bVar361;
  byte bVar362;
  byte bVar363;
  byte bVar364;
  byte bVar365;
  byte bVar366;
  byte bVar367;
  byte bVar368;
  byte bVar369;
  byte bVar370;
  byte bVar371;
  undefined1 auVar350 [16];
  byte bVar372;
  byte bVar373;
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar145 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined4 uVar151;
  undefined6 uVar157;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined8 uVar158;
  undefined1 auVar159 [12];
  undefined1 auVar160 [14];
  undefined1 auVar169 [16];
  undefined1 uVar171;
  undefined1 uVar173;
  undefined1 uVar175;
  undefined1 uVar177;
  undefined1 uVar179;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 uVar241;
  undefined1 uVar242;
  undefined1 uVar243;
  undefined1 uVar244;
  undefined1 uVar245;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 uVar255;
  undefined1 uVar256;
  undefined1 uVar258;
  undefined1 uVar259;
  undefined1 uVar261;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined6 uVar283;
  undefined8 uVar284;
  undefined1 auVar285 [12];
  undefined1 auVar286 [14];
  undefined1 auVar290 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  byte bVar331;
  byte bVar336;
  byte bVar338;
  byte bVar340;
  byte bVar342;
  byte bVar344;
  byte bVar346;
  byte bVar348;
  
  bVar349 = *_blimit0;
  bVar351 = _blimit0[1];
  bVar352 = _blimit0[2];
  bVar353 = _blimit0[3];
  bVar354 = _blimit0[4];
  bVar355 = _blimit0[5];
  bVar356 = _blimit0[6];
  bVar357 = _blimit0[7];
  bVar358 = *_blimit1;
  bVar360 = _blimit1[1];
  bVar362 = _blimit1[2];
  bVar364 = _blimit1[3];
  bVar366 = _blimit1[4];
  bVar368 = _blimit1[5];
  bVar370 = _blimit1[6];
  bVar372 = _blimit1[7];
  bVar68 = *_limit0;
  bVar69 = _limit0[1];
  bVar70 = _limit0[2];
  bVar71 = _limit0[3];
  bVar72 = _limit0[4];
  bVar73 = _limit0[5];
  bVar74 = _limit0[6];
  bVar75 = _limit0[7];
  bVar76 = *_limit1;
  bVar77 = _limit1[1];
  bVar78 = _limit1[2];
  bVar79 = _limit1[3];
  bVar80 = _limit1[4];
  bVar81 = _limit1[5];
  bVar82 = _limit1[6];
  bVar83 = _limit1[7];
  bVar361 = *_thresh0;
  bVar359 = _thresh0[1];
  bVar373 = _thresh0[2];
  bVar371 = _thresh0[3];
  bVar369 = *_thresh1;
  bVar365 = _thresh1[1];
  bVar367 = _thresh1[2];
  bVar363 = _thresh1[3];
  uVar1 = *(ulong *)(s + -3);
  lVar132 = (long)p;
  uVar158 = *(undefined8 *)(s + lVar132 + -3);
  auVar332._8_6_ = 0;
  auVar332._0_8_ = uVar1;
  auVar332[0xe] = (char)(uVar1 >> 0x38);
  auVar332[0xf] = (char)((ulong)uVar158 >> 0x38);
  auVar310._14_2_ = auVar332._14_2_;
  auVar310._8_5_ = 0;
  auVar310._0_8_ = uVar1;
  auVar310[0xd] = (char)((ulong)uVar158 >> 0x30);
  auVar374._13_3_ = auVar310._13_3_;
  auVar374._8_4_ = 0;
  auVar374._0_8_ = uVar1;
  auVar374[0xc] = (char)(uVar1 >> 0x30);
  auVar300._12_4_ = auVar374._12_4_;
  auVar300._8_3_ = 0;
  auVar300._0_8_ = uVar1;
  uVar178 = (undefined1)((ulong)uVar158 >> 0x28);
  auVar300[0xb] = uVar178;
  auVar140._11_5_ = auVar300._11_5_;
  auVar140._8_2_ = 0;
  auVar140._0_8_ = uVar1;
  auVar140[10] = (char)(uVar1 >> 0x28);
  auVar139._10_6_ = auVar140._10_6_;
  auVar139[8] = 0;
  auVar139._0_8_ = uVar1;
  uVar176 = (undefined1)((ulong)uVar158 >> 0x20);
  auVar139[9] = uVar176;
  auVar138._9_7_ = auVar139._9_7_;
  auVar138[8] = (char)(uVar1 >> 0x20);
  auVar138._0_8_ = uVar1;
  uVar174 = (undefined1)((ulong)uVar158 >> 0x18);
  Var87 = CONCAT91(CONCAT81(auVar138._8_8_,uVar174),(char)(uVar1 >> 0x18));
  uVar172 = (undefined1)((ulong)uVar158 >> 0x10);
  auVar86._2_10_ = Var87;
  auVar86[1] = uVar172;
  auVar86[0] = (char)(uVar1 >> 0x10);
  uVar170 = (undefined1)((ulong)uVar158 >> 8);
  auVar85._2_12_ = auVar86;
  auVar85[1] = uVar170;
  auVar85[0] = (char)(uVar1 >> 8);
  auVar137._0_2_ = CONCAT11((char)uVar158,(byte)uVar1);
  auVar137._2_14_ = auVar85;
  uVar2 = *(ulong *)(s + lVar132 * 2 + -3);
  uVar284 = *(undefined8 *)(s + lVar132 * 3 + -3);
  auVar167._8_6_ = 0;
  auVar167._0_8_ = uVar2;
  auVar167[0xe] = (char)(uVar2 >> 0x38);
  auVar167[0xf] = (char)((ulong)uVar284 >> 0x38);
  auVar166._14_2_ = auVar167._14_2_;
  auVar166._8_5_ = 0;
  auVar166._0_8_ = uVar2;
  auVar166[0xd] = (char)((ulong)uVar284 >> 0x30);
  auVar165._13_3_ = auVar166._13_3_;
  auVar165._8_4_ = 0;
  auVar165._0_8_ = uVar2;
  auVar165[0xc] = (char)(uVar2 >> 0x30);
  auVar164._12_4_ = auVar165._12_4_;
  auVar164._8_3_ = 0;
  auVar164._0_8_ = uVar2;
  uVar201 = (undefined1)((ulong)uVar284 >> 0x28);
  auVar164[0xb] = uVar201;
  uVar179 = (undefined1)(uVar2 >> 0x28);
  auVar163._11_5_ = auVar164._11_5_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar2;
  auVar163[10] = uVar179;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162[8] = 0;
  auVar162._0_8_ = uVar2;
  uVar197 = (undefined1)((ulong)uVar284 >> 0x20);
  auVar162[9] = uVar197;
  uVar177 = (undefined1)(uVar2 >> 0x20);
  auVar161._9_7_ = auVar162._9_7_;
  auVar161[8] = uVar177;
  auVar161._0_8_ = uVar2;
  uVar194 = (undefined1)((ulong)uVar284 >> 0x18);
  uVar175 = (undefined1)(uVar2 >> 0x18);
  Var90 = CONCAT91(CONCAT81(auVar161._8_8_,uVar194),uVar175);
  uVar190 = (undefined1)((ulong)uVar284 >> 0x10);
  auVar89._2_10_ = Var90;
  auVar89[1] = uVar190;
  uVar173 = (undefined1)(uVar2 >> 0x10);
  auVar89[0] = uVar173;
  uVar187 = (undefined1)((ulong)uVar284 >> 8);
  auVar88._2_12_ = auVar89;
  auVar88[1] = uVar187;
  uVar171 = (undefined1)(uVar2 >> 8);
  auVar88[0] = uVar171;
  uVar3 = *(ulong *)(s + lVar132 * 4 + -3);
  lVar7 = lVar132 * 5;
  uVar4 = *(undefined8 *)(s + lVar7 + -3);
  auVar240._8_6_ = 0;
  auVar240._0_8_ = uVar3;
  auVar240[0xe] = (char)(uVar3 >> 0x38);
  auVar240[0xf] = (char)((ulong)uVar4 >> 0x38);
  auVar239._14_2_ = auVar240._14_2_;
  auVar239._8_5_ = 0;
  auVar239._0_8_ = uVar3;
  auVar239[0xd] = (char)((ulong)uVar4 >> 0x30);
  auVar238._13_3_ = auVar239._13_3_;
  auVar238._8_4_ = 0;
  auVar238._0_8_ = uVar3;
  auVar238[0xc] = (char)(uVar3 >> 0x30);
  uVar202 = (undefined1)((ulong)uVar4 >> 0x28);
  auVar237._12_4_ = auVar238._12_4_;
  auVar237._8_3_ = 0;
  auVar237._0_8_ = uVar3;
  auVar237[0xb] = uVar202;
  uVar245 = (undefined1)(uVar3 >> 0x28);
  auVar236._11_5_ = auVar237._11_5_;
  auVar236._8_2_ = 0;
  auVar236._0_8_ = uVar3;
  auVar236[10] = uVar245;
  uVar198 = (undefined1)((ulong)uVar4 >> 0x20);
  auVar235._10_6_ = auVar236._10_6_;
  auVar235[8] = 0;
  auVar235._0_8_ = uVar3;
  auVar235[9] = uVar198;
  uVar244 = (undefined1)(uVar3 >> 0x20);
  auVar234._9_7_ = auVar235._9_7_;
  auVar234[8] = uVar244;
  auVar234._0_8_ = uVar3;
  uVar195 = (undefined1)((ulong)uVar4 >> 0x18);
  uVar243 = (undefined1)(uVar3 >> 0x18);
  Var93 = CONCAT91(CONCAT81(auVar234._8_8_,uVar195),uVar243);
  uVar191 = (undefined1)((ulong)uVar4 >> 0x10);
  auVar92._2_10_ = Var93;
  auVar92[1] = uVar191;
  uVar242 = (undefined1)(uVar3 >> 0x10);
  auVar92[0] = uVar242;
  uVar188 = (undefined1)((ulong)uVar4 >> 8);
  auVar91._2_12_ = auVar92;
  auVar91[1] = uVar188;
  uVar241 = (undefined1)(uVar3 >> 8);
  auVar91[0] = uVar241;
  auVar233._0_2_ = CONCAT11((char)uVar4,(char)uVar3);
  auVar233._2_14_ = auVar91;
  lVar133 = lVar132 * 6;
  uVar5 = *(ulong *)(s + lVar133 + -3);
  lVar134 = lVar132 * 7;
  uVar6 = *(undefined8 *)(s + lVar134 + -3);
  auVar252._8_6_ = 0;
  auVar252._0_8_ = uVar5;
  auVar252[0xe] = (char)(uVar5 >> 0x38);
  auVar252[0xf] = (char)((ulong)uVar6 >> 0x38);
  auVar251._14_2_ = auVar252._14_2_;
  auVar251._8_5_ = 0;
  auVar251._0_8_ = uVar5;
  auVar251[0xd] = (char)((ulong)uVar6 >> 0x30);
  auVar250._13_3_ = auVar251._13_3_;
  auVar250._8_4_ = 0;
  auVar250._0_8_ = uVar5;
  auVar250[0xc] = (char)(uVar5 >> 0x30);
  uVar203 = (undefined1)((ulong)uVar6 >> 0x28);
  auVar249._12_4_ = auVar250._12_4_;
  auVar249._8_3_ = 0;
  auVar249._0_8_ = uVar5;
  auVar249[0xb] = uVar203;
  uVar261 = (undefined1)(uVar5 >> 0x28);
  auVar248._11_5_ = auVar249._11_5_;
  auVar248._8_2_ = 0;
  auVar248._0_8_ = uVar5;
  auVar248[10] = uVar261;
  uVar199 = (undefined1)((ulong)uVar6 >> 0x20);
  auVar247._10_6_ = auVar248._10_6_;
  auVar247[8] = 0;
  auVar247._0_8_ = uVar5;
  auVar247[9] = uVar199;
  uVar259 = (undefined1)(uVar5 >> 0x20);
  auVar246._9_7_ = auVar247._9_7_;
  auVar246[8] = uVar259;
  auVar246._0_8_ = uVar5;
  uVar196 = (undefined1)((ulong)uVar6 >> 0x18);
  uVar258 = (undefined1)(uVar5 >> 0x18);
  Var96 = CONCAT91(CONCAT81(auVar246._8_8_,uVar196),uVar258);
  uVar192 = (undefined1)((ulong)uVar6 >> 0x10);
  auVar95._2_10_ = Var96;
  auVar95[1] = uVar192;
  uVar256 = (undefined1)(uVar5 >> 0x10);
  auVar95[0] = uVar256;
  uVar189 = (undefined1)((ulong)uVar6 >> 8);
  auVar94._2_12_ = auVar95;
  auVar94[1] = uVar189;
  uVar255 = (undefined1)(uVar5 >> 8);
  auVar94[0] = uVar255;
  uVar280 = (ushort)Var87;
  auVar185._0_12_ = auVar137._0_12_;
  auVar185._12_2_ = uVar280;
  auVar185._14_2_ = (short)Var90;
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._0_10_ = auVar137._0_10_;
  auVar184._10_2_ = auVar89._0_2_;
  uVar150 = auVar86._0_2_;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._0_8_ = auVar137._0_8_;
  auVar183._8_2_ = uVar150;
  auVar97._4_8_ = auVar183._8_8_;
  auVar97._2_2_ = auVar88._0_2_;
  uVar149 = auVar85._0_2_;
  auVar97._0_2_ = uVar149;
  auVar182._0_4_ = CONCAT22(CONCAT11((char)uVar284,(char)uVar2),auVar137._0_2_);
  auVar182._4_12_ = auVar97;
  auVar270._0_12_ = auVar233._0_12_;
  auVar270._12_2_ = (short)Var93;
  auVar270._14_2_ = (short)Var96;
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._0_10_ = auVar233._0_10_;
  auVar269._10_2_ = auVar95._0_2_;
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._0_8_ = auVar233._0_8_;
  auVar268._8_2_ = auVar92._0_2_;
  auVar98._4_8_ = auVar268._8_8_;
  auVar98._2_2_ = auVar94._0_2_;
  auVar98._0_2_ = auVar91._0_2_;
  auVar211._0_8_ = auVar182._0_8_;
  auVar211._8_4_ = auVar97._0_4_;
  auVar211._12_4_ = auVar98._0_4_;
  uVar227 = auVar211._8_8_;
  uVar210 = CONCAT44(CONCAT22(CONCAT11((char)uVar6,(char)uVar5),auVar233._0_2_),auVar182._0_4_);
  auVar181._0_8_ = CONCAT44(auVar268._8_4_,auVar183._8_4_);
  auVar181._8_4_ = auVar184._12_4_;
  auVar186._12_4_ = auVar269._12_4_;
  auVar186._0_12_ = auVar181;
  uVar135 = auVar138._8_2_;
  uVar136 = CONCAT22(auVar161._8_2_,uVar135);
  uVar231 = auVar140._10_2_;
  auVar142._0_8_ = CONCAT26(auVar163._10_2_,CONCAT24(uVar231,uVar136));
  uVar232 = CONCAT22(auVar246._8_2_,auVar234._8_2_);
  uVar151 = (undefined4)((ulong)auVar142._0_8_ >> 0x20);
  auVar142._8_4_ = uVar151;
  auVar142._12_4_ = (int)(CONCAT26(auVar248._10_2_,CONCAT24(auVar236._10_2_,uVar232)) >> 0x20);
  auVar141._8_8_ = auVar142._8_8_;
  auVar141._0_8_ = CONCAT44(uVar232,uVar136);
  auVar350._8_8_ = auVar141._0_8_;
  auVar350._0_8_ = uVar227;
  uVar267 = auVar186._8_8_;
  auVar299._8_8_ = uVar267;
  auVar299._0_8_ = auVar181._0_8_;
  auVar318._8_8_ = uVar227;
  auVar318._0_8_ = auVar181._0_8_;
  auVar168._8_8_ = auVar141._0_8_;
  auVar168._0_8_ = uVar267;
  auVar332 = psubusb(auVar350,auVar299);
  auVar310 = psubusb(auVar299,auVar350);
  auVar310 = auVar310 | auVar332;
  auVar332 = psubusb(auVar318,auVar168);
  auVar374 = psubusb(auVar168,auVar318);
  auVar374 = auVar374 | auVar332;
  bVar298 = auVar310[0];
  bVar331 = auVar310[8];
  bVar330 = (bVar331 < bVar298) * bVar298 | (bVar331 >= bVar298) * bVar331;
  bVar302 = auVar310[1];
  bVar336 = auVar310[9];
  bVar335 = (bVar336 < bVar302) * bVar302 | (bVar336 >= bVar302) * bVar336;
  bVar303 = auVar310[2];
  bVar338 = auVar310[10];
  bVar337 = (bVar338 < bVar303) * bVar303 | (bVar338 >= bVar303) * bVar338;
  bVar304 = auVar310[3];
  bVar340 = auVar310[0xb];
  bVar339 = (bVar340 < bVar304) * bVar304 | (bVar340 >= bVar304) * bVar340;
  bVar305 = auVar310[4];
  bVar342 = auVar310[0xc];
  bVar341 = (bVar342 < bVar305) * bVar305 | (bVar342 >= bVar305) * bVar342;
  bVar306 = auVar310[5];
  bVar344 = auVar310[0xd];
  bVar343 = (bVar344 < bVar306) * bVar306 | (bVar344 >= bVar306) * bVar344;
  bVar307 = auVar310[6];
  bVar346 = auVar310[0xe];
  bVar345 = (bVar346 < bVar307) * bVar307 | (bVar346 >= bVar307) * bVar346;
  bVar308 = auVar310[7];
  bVar348 = auVar310[0xf];
  bVar347 = (bVar348 < bVar308) * bVar308 | (bVar348 >= bVar308) * bVar348;
  uVar232 = CONCAT13(-((byte)((bVar339 < bVar371) * bVar339 | (bVar339 >= bVar371) * bVar371) ==
                      bVar339),
                     CONCAT12(-((byte)((bVar337 < bVar373) * bVar337 |
                                      (bVar337 >= bVar373) * bVar373) == bVar337),
                              CONCAT11(-((byte)((bVar335 < bVar359) * bVar335 |
                                               (bVar335 >= bVar359) * bVar359) == bVar335),
                                       -((byte)((bVar330 < bVar361) * bVar330 |
                                               (bVar330 >= bVar361) * bVar361) == bVar330))));
  uVar320 = CONCAT17(-((byte)((bVar347 < bVar363) * bVar347 | (bVar347 >= bVar363) * bVar363) ==
                      bVar347),
                     CONCAT16(-((byte)((bVar345 < bVar367) * bVar345 |
                                      (bVar345 >= bVar367) * bVar367) == bVar345),
                              CONCAT15(-((byte)((bVar343 < bVar365) * bVar343 |
                                               (bVar343 >= bVar365) * bVar365) == bVar343),
                                       CONCAT14(-((byte)((bVar341 < bVar369) * bVar341 |
                                                        (bVar341 >= bVar369) * bVar369) == bVar341),
                                                uVar232))));
  auVar333._8_8_ = 0;
  auVar333._0_8_ = auVar374._0_8_;
  auVar375._0_2_ = auVar374._8_2_ >> 1;
  auVar375._2_2_ = auVar374._10_2_ >> 1;
  auVar375._4_2_ = auVar374._12_2_ >> 1;
  auVar375._6_2_ = auVar374._14_2_ >> 1;
  auVar375._8_8_ = 0;
  auVar310 = paddusb(auVar333,auVar333);
  auVar310 = paddusb(auVar375 & _DAT_0042b850,auVar310);
  auVar334._8_8_ = auVar141._8_8_;
  auVar334._0_8_ = uVar210;
  bVar361 = auVar310[0];
  bVar359 = auVar310[1];
  bVar373 = auVar310[2];
  bVar371 = auVar310[3];
  bVar369 = auVar310[4];
  bVar365 = auVar310[5];
  bVar367 = auVar310[6];
  bVar363 = auVar310[7];
  bVar330 = auVar310[8];
  bVar335 = auVar310[9];
  bVar337 = auVar310[10];
  bVar339 = auVar310[0xb];
  bVar341 = auVar310[0xc];
  bVar343 = auVar310[0xd];
  bVar345 = auVar310[0xe];
  bVar347 = auVar310[0xf];
  auVar332 = psubusb(auVar334,auVar350);
  auVar310 = psubusb(auVar350,auVar334);
  auVar310 = auVar310 | auVar332;
  auVar253._8_4_ = uVar232;
  auVar253._0_8_ = uVar320;
  auVar253._12_4_ = (int)((ulong)uVar320 >> 0x20);
  bVar361 = -((byte)((bVar361 < bVar349) * bVar361 | (bVar361 >= bVar349) * bVar349) == bVar361) ^
            0xff;
  bVar359 = -((byte)((bVar359 < bVar351) * bVar359 | (bVar359 >= bVar351) * bVar351) == bVar359) ^
            0xff;
  bVar373 = -((byte)((bVar373 < bVar352) * bVar373 | (bVar373 >= bVar352) * bVar352) == bVar373) ^
            0xff;
  bVar371 = -((byte)((bVar371 < bVar353) * bVar371 | (bVar371 >= bVar353) * bVar353) == bVar371) ^
            0xff;
  bVar369 = -((byte)((bVar369 < bVar358) * bVar369 | (bVar369 >= bVar358) * bVar358) == bVar369) ^
            0xff;
  bVar365 = -((byte)((bVar365 < bVar360) * bVar365 | (bVar365 >= bVar360) * bVar360) == bVar365) ^
            0xff;
  bVar367 = -((byte)((bVar367 < bVar362) * bVar367 | (bVar367 >= bVar362) * bVar362) == bVar367) ^
            0xff;
  bVar363 = -((byte)((bVar363 < bVar364) * bVar363 | (bVar363 >= bVar364) * bVar364) == bVar363) ^
            0xff;
  bVar330 = -((byte)((bVar330 < bVar354) * bVar330 | (bVar330 >= bVar354) * bVar354) == bVar330) ^
            0xff;
  bVar335 = -((byte)((bVar335 < bVar355) * bVar335 | (bVar335 >= bVar355) * bVar355) == bVar335) ^
            0xff;
  bVar337 = -((byte)((bVar337 < bVar356) * bVar337 | (bVar337 >= bVar356) * bVar356) == bVar337) ^
            0xff;
  bVar339 = -((byte)((bVar339 < bVar357) * bVar339 | (bVar339 >= bVar357) * bVar357) == bVar339) ^
            0xff;
  bVar341 = -((byte)((bVar341 < bVar366) * bVar341 | (bVar341 >= bVar366) * bVar366) == bVar341) ^
            0xff;
  bVar343 = -((byte)((bVar343 < bVar368) * bVar343 | (bVar343 >= bVar368) * bVar368) == bVar343) ^
            0xff;
  bVar345 = -((byte)((bVar345 < bVar370) * bVar345 | (bVar345 >= bVar370) * bVar370) == bVar345) ^
            0xff;
  bVar347 = -((byte)((bVar347 < bVar372) * bVar347 | (bVar347 >= bVar372) * bVar372) == bVar347) ^
            0xff;
  bVar349 = auVar310[0];
  bVar349 = (bVar349 < bVar298) * bVar298 | (bVar349 >= bVar298) * bVar349;
  bVar351 = auVar310[1];
  bVar351 = (bVar351 < bVar302) * bVar302 | (bVar351 >= bVar302) * bVar351;
  bVar352 = auVar310[2];
  bVar352 = (bVar352 < bVar303) * bVar303 | (bVar352 >= bVar303) * bVar352;
  bVar353 = auVar310[3];
  bVar353 = (bVar353 < bVar304) * bVar304 | (bVar353 >= bVar304) * bVar353;
  bVar354 = auVar310[4];
  bVar354 = (bVar354 < bVar305) * bVar305 | (bVar354 >= bVar305) * bVar354;
  bVar355 = auVar310[5];
  bVar355 = (bVar355 < bVar306) * bVar306 | (bVar355 >= bVar306) * bVar355;
  bVar356 = auVar310[6];
  bVar356 = (bVar356 < bVar307) * bVar307 | (bVar356 >= bVar307) * bVar356;
  bVar357 = auVar310[7];
  bVar357 = (bVar357 < bVar308) * bVar308 | (bVar357 >= bVar308) * bVar357;
  bVar358 = auVar310[8];
  bVar358 = (bVar358 < bVar331) * bVar331 | (bVar358 >= bVar331) * bVar358;
  bVar360 = auVar310[9];
  bVar360 = (bVar360 < bVar336) * bVar336 | (bVar360 >= bVar336) * bVar360;
  bVar362 = auVar310[10];
  bVar362 = (bVar362 < bVar338) * bVar338 | (bVar362 >= bVar338) * bVar362;
  bVar364 = auVar310[0xb];
  bVar364 = (bVar364 < bVar340) * bVar340 | (bVar364 >= bVar340) * bVar364;
  bVar366 = auVar310[0xc];
  bVar366 = (bVar366 < bVar342) * bVar342 | (bVar366 >= bVar342) * bVar366;
  bVar368 = auVar310[0xd];
  bVar368 = (bVar368 < bVar344) * bVar344 | (bVar368 >= bVar344) * bVar368;
  bVar370 = auVar310[0xe];
  bVar372 = auVar310[0xf];
  bVar370 = (bVar370 < bVar346) * bVar346 | (bVar370 >= bVar346) * bVar370;
  bVar372 = (bVar372 < bVar348) * bVar348 | (bVar372 >= bVar348) * bVar372;
  bVar349 = (bVar349 < bVar361) * bVar361 | (bVar349 >= bVar361) * bVar349;
  bVar351 = (bVar351 < bVar359) * bVar359 | (bVar351 >= bVar359) * bVar351;
  bVar352 = (bVar352 < bVar373) * bVar373 | (bVar352 >= bVar373) * bVar352;
  bVar353 = (bVar353 < bVar371) * bVar371 | (bVar353 >= bVar371) * bVar353;
  bVar354 = (bVar354 < bVar369) * bVar369 | (bVar354 >= bVar369) * bVar354;
  bVar355 = (bVar355 < bVar365) * bVar365 | (bVar355 >= bVar365) * bVar355;
  bVar356 = (bVar356 < bVar367) * bVar367 | (bVar356 >= bVar367) * bVar356;
  bVar357 = (bVar357 < bVar363) * bVar363 | (bVar357 >= bVar363) * bVar357;
  bVar359 = (bVar358 < bVar330) * bVar330 | (bVar358 >= bVar330) * bVar358;
  bVar361 = (bVar360 < bVar335) * bVar335 | (bVar360 >= bVar335) * bVar360;
  bVar363 = (bVar362 < bVar337) * bVar337 | (bVar362 >= bVar337) * bVar362;
  bVar365 = (bVar364 < bVar339) * bVar339 | (bVar364 >= bVar339) * bVar364;
  bVar367 = (bVar366 < bVar341) * bVar341 | (bVar366 >= bVar341) * bVar366;
  bVar369 = (bVar368 < bVar343) * bVar343 | (bVar368 >= bVar343) * bVar368;
  bVar371 = (bVar370 < bVar345) * bVar345 | (bVar370 >= bVar345) * bVar370;
  bVar373 = (bVar372 < bVar347) * bVar347 | (bVar372 >= bVar347) * bVar372;
  bVar330 = (bVar359 < bVar349) * bVar349 | (bVar359 >= bVar349) * bVar359;
  bVar335 = (bVar361 < bVar351) * bVar351 | (bVar361 >= bVar351) * bVar361;
  bVar337 = (bVar363 < bVar352) * bVar352 | (bVar363 >= bVar352) * bVar363;
  bVar339 = (bVar365 < bVar353) * bVar353 | (bVar365 >= bVar353) * bVar365;
  bVar341 = (bVar367 < bVar354) * bVar354 | (bVar367 >= bVar354) * bVar367;
  bVar343 = (bVar369 < bVar355) * bVar355 | (bVar369 >= bVar355) * bVar369;
  bVar345 = (bVar371 < bVar356) * bVar356 | (bVar371 >= bVar356) * bVar371;
  bVar347 = (bVar373 < bVar357) * bVar357 | (bVar373 >= bVar357) * bVar373;
  bVar359 = (bVar359 != 0) * bVar359;
  bVar361 = (bVar361 != 0) * bVar361;
  bVar363 = (bVar363 != 0) * bVar363;
  bVar365 = (bVar365 != 0) * bVar365;
  bVar367 = (bVar367 != 0) * bVar367;
  bVar369 = (bVar369 != 0) * bVar369;
  bVar371 = (bVar371 != 0) * bVar371;
  bVar373 = (bVar373 != 0) * bVar373;
  auVar279[0] = -((byte)((bVar330 < bVar68) * bVar330 | (bVar330 >= bVar68) * bVar68) == bVar330);
  auVar279[1] = -((byte)((bVar335 < bVar69) * bVar335 | (bVar335 >= bVar69) * bVar69) == bVar335);
  auVar279[2] = -((byte)((bVar337 < bVar70) * bVar337 | (bVar337 >= bVar70) * bVar70) == bVar337);
  auVar279[3] = -((byte)((bVar339 < bVar71) * bVar339 | (bVar339 >= bVar71) * bVar71) == bVar339);
  auVar279[4] = -((byte)((bVar341 < bVar76) * bVar341 | (bVar341 >= bVar76) * bVar76) == bVar341);
  auVar279[5] = -((byte)((bVar343 < bVar77) * bVar343 | (bVar343 >= bVar77) * bVar77) == bVar343);
  auVar279[6] = -((byte)((bVar345 < bVar78) * bVar345 | (bVar345 >= bVar78) * bVar78) == bVar345);
  auVar279[7] = -((byte)((bVar347 < bVar79) * bVar347 | (bVar347 >= bVar79) * bVar79) == bVar347);
  auVar279[8] = -((byte)((bVar359 < bVar72) * bVar359 | (bVar359 >= bVar72) * bVar72) == bVar359);
  auVar279[9] = -((byte)((bVar361 < bVar73) * bVar361 | (bVar361 >= bVar73) * bVar73) == bVar361);
  auVar279[10] = -((byte)((bVar363 < bVar74) * bVar363 | (bVar363 >= bVar74) * bVar74) == bVar363);
  auVar279[0xb] = -((byte)((bVar365 < bVar75) * bVar365 | (bVar365 >= bVar75) * bVar75) == bVar365);
  auVar279[0xc] = -((byte)((bVar367 < bVar80) * bVar367 | (bVar367 >= bVar80) * bVar80) == bVar367);
  auVar279[0xd] = -((byte)((bVar369 < bVar81) * bVar369 | (bVar369 >= bVar81) * bVar81) == bVar369);
  auVar279[0xe] = -((byte)((bVar371 < bVar82) * bVar371 | (bVar371 >= bVar82) * bVar82) == bVar371);
  auVar279[0xf] = -((byte)((bVar373 < bVar83) * bVar373 | (bVar373 >= bVar83) * bVar83) == bVar373);
  auVar332 = psubsb(auVar318 ^ _DAT_0042cb20,auVar168 ^ _DAT_0042cb20);
  auVar310 = psubsb(~auVar253 & auVar332 >> 0x40,auVar332);
  auVar310 = psubsb(auVar310,auVar332);
  auVar374 = psubsb(auVar310,auVar332);
  auVar374 = auVar374 & auVar279;
  auVar322._0_4_ = auVar374._0_4_;
  auVar212._0_8_ = auVar374._0_8_;
  auVar212._8_4_ = auVar322._0_4_;
  auVar212._12_4_ = auVar374._4_4_;
  auVar310 = paddsb(auVar212,_DAT_0046fc80);
  auVar287[1] = auVar310[8];
  auVar287[0] = auVar332[8];
  auVar287[2] = auVar332[9];
  auVar287[3] = auVar310[9];
  auVar287[4] = auVar332[10];
  auVar287[5] = auVar310[10];
  auVar287[6] = auVar332[0xb];
  auVar287[7] = auVar310[0xb];
  auVar287[8] = auVar332[0xc];
  auVar287[9] = auVar310[0xc];
  auVar287[10] = auVar332[0xd];
  auVar287[0xb] = auVar310[0xd];
  auVar287[0xc] = auVar332[0xe];
  auVar287[0xd] = auVar310[0xe];
  auVar287[0xe] = auVar332[0xf];
  auVar287[0xf] = auVar310[0xf];
  auVar220._0_14_ = auVar310._0_14_;
  auVar220[0xe] = auVar310[7];
  auVar220[0xf] = auVar310[7];
  auVar219._14_2_ = auVar220._14_2_;
  auVar219._0_13_ = auVar310._0_13_;
  auVar219[0xd] = auVar310[6];
  auVar218._13_3_ = auVar219._13_3_;
  auVar218._0_12_ = auVar310._0_12_;
  auVar218[0xc] = auVar310[6];
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._0_11_ = auVar310._0_11_;
  auVar217[0xb] = auVar310[5];
  auVar216._11_5_ = auVar217._11_5_;
  auVar216._0_10_ = auVar310._0_10_;
  auVar216[10] = auVar310[5];
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._0_9_ = auVar310._0_9_;
  auVar215[9] = auVar310[4];
  auVar214._9_7_ = auVar215._9_7_;
  auVar214._0_8_ = auVar310._0_8_;
  auVar214[8] = auVar310[4];
  auVar213._8_8_ = auVar214._8_8_;
  auVar213[7] = auVar310[3];
  auVar213[6] = auVar310[3];
  auVar213[5] = auVar310[2];
  auVar213[4] = auVar310[2];
  auVar213[3] = auVar310[1];
  auVar213[2] = auVar310[1];
  auVar213[0] = auVar310[0];
  auVar213[1] = auVar213[0];
  auVar310 = psraw(auVar213,0xb);
  auVar332 = psraw(auVar287,0xb);
  auVar310 = packsswb(auVar310,auVar332);
  auVar329._0_14_ = auVar374._0_14_;
  auVar329[0xe] = auVar374[7];
  auVar329[0xf] = auVar310[7] + '\x01';
  auVar328._14_2_ = auVar329._14_2_;
  auVar328._0_13_ = auVar374._0_13_;
  auVar328[0xd] = auVar310[6] + '\x01';
  auVar327._13_3_ = auVar328._13_3_;
  auVar327._0_12_ = auVar374._0_12_;
  auVar327[0xc] = auVar374[6];
  auVar326._12_4_ = auVar327._12_4_;
  auVar326._0_11_ = auVar374._0_11_;
  auVar326[0xb] = auVar310[5] + '\x01';
  auVar325._11_5_ = auVar326._11_5_;
  auVar325._0_10_ = auVar374._0_10_;
  auVar325[10] = auVar374[5];
  auVar324._10_6_ = auVar325._10_6_;
  auVar324._0_9_ = auVar374._0_9_;
  auVar324[9] = auVar310[4] + '\x01';
  auVar323._9_7_ = auVar324._9_7_;
  auVar323[8] = auVar374[4];
  auVar323._0_8_ = auVar212._0_8_;
  auVar322._8_8_ = auVar323._8_8_;
  auVar322[7] = auVar310[3] + '\x01';
  auVar322[6] = auVar374[3];
  auVar322[5] = auVar310[2] + '\x01';
  auVar322[4] = auVar374[2];
  auVar321._4_12_ = auVar322._4_12_;
  auVar321[3] = auVar310[1] + '\x01';
  auVar321[2] = auVar374[1];
  auVar321[0] = auVar374[0];
  auVar321[1] = auVar310[0] + '\x01';
  auVar332 = psraw(auVar321,9);
  auVar332 = packsswb(auVar332,auVar332);
  auVar288._8_8_ = SUB168(auVar332 & auVar253,8);
  auVar288._0_8_ = auVar310._8_8_;
  auVar221._0_8_ = auVar310._0_8_;
  auVar221._8_8_ = SUB168(auVar332 & auVar253,0);
  auVar310 = psubsb(auVar168 ^ _DAT_0042cb20,auVar221);
  auVar374 = paddsb(auVar288,auVar318 ^ _DAT_0042cb20);
  auVar310 = auVar310 ^ _DAT_0042cb20;
  auVar374 = auVar374 ^ _DAT_0042cb20;
  auVar332 = psubusb(auVar334,auVar299);
  auVar300 = psubusb(auVar299,auVar334);
  auVar300 = auVar300 | auVar332;
  bVar361 = auVar300[0];
  bVar298 = (bVar361 < bVar298) * bVar298 | (bVar361 >= bVar298) * bVar361;
  bVar361 = auVar300[1];
  bVar302 = (bVar361 < bVar302) * bVar302 | (bVar361 >= bVar302) * bVar361;
  bVar361 = auVar300[2];
  bVar303 = (bVar361 < bVar303) * bVar303 | (bVar361 >= bVar303) * bVar361;
  bVar361 = auVar300[3];
  bVar304 = (bVar361 < bVar304) * bVar304 | (bVar361 >= bVar304) * bVar361;
  bVar361 = auVar300[4];
  bVar305 = (bVar361 < bVar305) * bVar305 | (bVar361 >= bVar305) * bVar361;
  bVar361 = auVar300[5];
  bVar306 = (bVar361 < bVar306) * bVar306 | (bVar361 >= bVar306) * bVar361;
  bVar361 = auVar300[6];
  bVar307 = (bVar361 < bVar307) * bVar307 | (bVar361 >= bVar307) * bVar361;
  bVar361 = auVar300[7];
  bVar308 = (bVar361 < bVar308) * bVar308 | (bVar361 >= bVar308) * bVar361;
  bVar361 = auVar300[8];
  bVar361 = (bVar361 < bVar331) * bVar331 | (bVar361 >= bVar331) * bVar361;
  bVar359 = auVar300[9];
  bVar359 = (bVar359 < bVar336) * bVar336 | (bVar359 >= bVar336) * bVar359;
  bVar373 = auVar300[10];
  bVar373 = (bVar373 < bVar338) * bVar338 | (bVar373 >= bVar338) * bVar373;
  bVar371 = auVar300[0xb];
  bVar371 = (bVar371 < bVar340) * bVar340 | (bVar371 >= bVar340) * bVar371;
  bVar369 = auVar300[0xc];
  bVar369 = (bVar369 < bVar342) * bVar342 | (bVar369 >= bVar342) * bVar369;
  bVar365 = auVar300[0xd];
  bVar365 = (bVar365 < bVar344) * bVar344 | (bVar365 >= bVar344) * bVar365;
  bVar367 = auVar300[0xe];
  bVar363 = auVar300[0xf];
  bVar367 = (bVar367 < bVar346) * bVar346 | (bVar367 >= bVar346) * bVar367;
  bVar363 = (bVar363 < bVar348) * bVar348 | (bVar363 >= bVar348) * bVar363;
  bVar298 = (bVar361 < bVar298) * bVar298 | (bVar361 >= bVar298) * bVar361;
  bVar302 = (bVar359 < bVar302) * bVar302 | (bVar359 >= bVar302) * bVar359;
  bVar303 = (bVar373 < bVar303) * bVar303 | (bVar373 >= bVar303) * bVar373;
  bVar304 = (bVar371 < bVar304) * bVar304 | (bVar371 >= bVar304) * bVar371;
  bVar305 = (bVar369 < bVar305) * bVar305 | (bVar369 >= bVar305) * bVar369;
  bVar306 = (bVar365 < bVar306) * bVar306 | (bVar365 >= bVar306) * bVar365;
  bVar307 = (bVar367 < bVar307) * bVar307 | (bVar367 >= bVar307) * bVar367;
  bVar308 = (bVar363 < bVar308) * bVar308 | (bVar363 >= bVar308) * bVar363;
  bVar361 = (bVar361 != 0) * bVar361;
  bVar359 = (bVar359 != 0) * bVar359;
  bVar373 = (bVar373 != 0) * bVar373;
  bVar371 = (bVar371 != 0) * bVar371;
  bVar369 = (bVar369 != 0) * bVar369;
  bVar365 = (bVar365 != 0) * bVar365;
  bVar367 = (bVar367 != 0) * bVar367;
  bVar363 = (bVar363 != 0) * bVar363;
  auVar254[0] = -((byte)((bVar298 == 0) * bVar298 | bVar298 != 0) == bVar298);
  auVar254[1] = -((byte)((bVar302 == 0) * bVar302 | bVar302 != 0) == bVar302);
  auVar254[2] = -((byte)((bVar303 == 0) * bVar303 | bVar303 != 0) == bVar303);
  auVar254[3] = -((byte)((bVar304 == 0) * bVar304 | bVar304 != 0) == bVar304);
  auVar254[4] = -((byte)((bVar305 == 0) * bVar305 | bVar305 != 0) == bVar305);
  auVar254[5] = -((byte)((bVar306 == 0) * bVar306 | bVar306 != 0) == bVar306);
  auVar254[6] = -((byte)((bVar307 == 0) * bVar307 | bVar307 != 0) == bVar307);
  auVar254[7] = -((byte)((bVar308 == 0) * bVar308 | bVar308 != 0) == bVar308);
  auVar254[8] = -((byte)((bVar361 == 0) * bVar361 | bVar361 != 0) == bVar361);
  auVar254[9] = -((byte)((bVar359 == 0) * bVar359 | bVar359 != 0) == bVar359);
  auVar254[10] = -((byte)((bVar373 == 0) * bVar373 | bVar373 != 0) == bVar373);
  auVar254[0xb] = -((byte)((bVar371 == 0) * bVar371 | bVar371 != 0) == bVar371);
  auVar254[0xc] = -((byte)((bVar369 == 0) * bVar369 | bVar369 != 0) == bVar369);
  auVar254[0xd] = -((byte)((bVar365 == 0) * bVar365 | bVar365 != 0) == bVar365);
  auVar254[0xe] = -((byte)((bVar367 == 0) * bVar367 | bVar367 != 0) == bVar367);
  auVar254[0xf] = -((byte)((bVar363 == 0) * bVar363 | bVar363 != 0) == bVar363);
  auVar254 = auVar254 & auVar279;
  auVar301._0_8_ = auVar254._0_8_;
  auVar301._8_4_ = auVar254._0_4_;
  auVar301._12_4_ = auVar254._4_4_;
  auVar222[0] = -(auVar254[0] == '\0');
  auVar222[1] = -(auVar254[1] == '\0');
  auVar222[2] = -(auVar254[2] == '\0');
  auVar222[3] = -(auVar254[3] == '\0');
  auVar222[4] = -(auVar254[4] == '\0');
  auVar222[5] = -(auVar254[5] == '\0');
  auVar222[6] = -(auVar254[6] == '\0');
  auVar222[7] = -(auVar254[7] == '\0');
  auVar222[8] = -(auVar254[0] == '\0');
  auVar222[9] = -(auVar254[1] == '\0');
  auVar222[10] = -(auVar254[2] == '\0');
  auVar222[0xb] = -(auVar254[3] == '\0');
  auVar222[0xc] = -(auVar254[4] == '\0');
  auVar222[0xd] = -(auVar254[5] == '\0');
  auVar222[0xe] = -(auVar254[6] == '\0');
  auVar222[0xf] = -(auVar254[7] == '\0');
  if ((ushort)((ushort)(SUB161(auVar222 >> 7,0) & 1) | (ushort)(SUB161(auVar222 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar222 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar222 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar222 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar222 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar222 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar222 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar222 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar222 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar222 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar222 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar222 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar222 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar222 >> 0x77,0) & 1) << 0xe | (ushort)(auVar222[0xf] >> 7) << 0xf
              ) != 0xffff) {
    auVar84._8_8_ = uVar227;
    auVar84._0_8_ = uVar210;
    auVar8[0xd] = 0;
    auVar8._0_13_ = auVar84._0_13_;
    auVar8[0xe] = (char)uVar6;
    auVar16[0xc] = (char)uVar5;
    auVar16._0_12_ = auVar84._0_12_;
    auVar16._13_2_ = auVar8._13_2_;
    auVar24[0xb] = 0;
    auVar24._0_11_ = auVar84._0_11_;
    auVar24._12_3_ = auVar16._12_3_;
    auVar32[10] = (char)uVar4;
    auVar32._0_10_ = auVar84._0_10_;
    auVar32._11_4_ = auVar24._11_4_;
    auVar40[9] = 0;
    auVar40._0_9_ = auVar84._0_9_;
    auVar40._10_5_ = auVar32._10_5_;
    auVar48[8] = (char)uVar3;
    auVar48._0_8_ = uVar210;
    auVar48._9_6_ = auVar40._9_6_;
    auVar99._7_8_ = 0;
    auVar99._0_7_ = auVar48._8_7_;
    Var100 = CONCAT81(SUB158(auVar99 << 0x40,7),(char)uVar284);
    auVar120._9_6_ = 0;
    auVar120._0_9_ = Var100;
    auVar101._1_10_ = SUB1510(auVar120 << 0x30,5);
    auVar101[0] = (char)uVar2;
    auVar121._11_4_ = 0;
    auVar121._0_11_ = auVar101;
    auVar60[2] = (char)uVar158;
    auVar60._0_2_ = auVar137._0_2_;
    auVar60._3_12_ = SUB1512(auVar121 << 0x20,3);
    uVar155 = (ushort)(byte)uVar1;
    auVar9._8_6_ = 0;
    auVar9._0_8_ = uVar227;
    auVar9[0xe] = uVar189;
    auVar17._8_4_ = 0;
    auVar17._0_8_ = uVar227;
    auVar17[0xc] = uVar255;
    auVar17._13_2_ = auVar9._13_2_;
    auVar25._8_4_ = 0;
    auVar25._0_8_ = uVar227;
    auVar25._12_3_ = auVar17._12_3_;
    auVar33._8_2_ = 0;
    auVar33._0_8_ = uVar227;
    auVar33[10] = uVar188;
    auVar33._11_4_ = auVar25._11_4_;
    auVar41._8_2_ = 0;
    auVar41._0_8_ = uVar227;
    auVar41._10_5_ = auVar33._10_5_;
    auVar49[8] = uVar241;
    auVar49._0_8_ = uVar227;
    auVar49._9_6_ = auVar41._9_6_;
    auVar102._7_8_ = 0;
    auVar102._0_7_ = auVar49._8_7_;
    Var103 = CONCAT81(SUB158(auVar102 << 0x40,7),uVar187);
    auVar122._9_6_ = 0;
    auVar122._0_9_ = Var103;
    auVar104._1_10_ = SUB1510(auVar122 << 0x30,5);
    auVar104[0] = uVar171;
    auVar123._11_4_ = 0;
    auVar123._0_11_ = auVar104;
    auVar61[2] = uVar170;
    auVar61._0_2_ = uVar149;
    auVar61._3_12_ = SUB1512(auVar123 << 0x20,3);
    auVar10[0xd] = 0;
    auVar10._0_13_ = auVar186._0_13_;
    auVar10[0xe] = uVar192;
    auVar18[0xc] = uVar256;
    auVar18._0_12_ = auVar181;
    auVar18._13_2_ = auVar10._13_2_;
    auVar26[0xb] = 0;
    auVar26._0_11_ = auVar181._0_11_;
    auVar26._12_3_ = auVar18._12_3_;
    auVar34[10] = uVar191;
    auVar34._0_10_ = auVar181._0_10_;
    auVar34._11_4_ = auVar26._11_4_;
    auVar42[9] = 0;
    auVar42._0_9_ = auVar181._0_9_;
    auVar42._10_5_ = auVar34._10_5_;
    auVar50[8] = uVar242;
    auVar50._0_8_ = auVar181._0_8_;
    auVar50._9_6_ = auVar42._9_6_;
    auVar105._7_8_ = 0;
    auVar105._0_7_ = auVar50._8_7_;
    Var106 = CONCAT81(SUB158(auVar105 << 0x40,7),uVar190);
    auVar124._9_6_ = 0;
    auVar124._0_9_ = Var106;
    auVar56[4] = uVar173;
    auVar56._0_4_ = auVar183._8_4_;
    auVar56._5_10_ = SUB1510(auVar124 << 0x30,5);
    auVar107._11_4_ = 0;
    auVar107._0_11_ = auVar56._4_11_;
    auVar62[2] = uVar172;
    auVar62._0_2_ = uVar150;
    auVar62._3_12_ = SUB1512(auVar107 << 0x20,3);
    auVar11._8_6_ = 0;
    auVar11._0_8_ = uVar267;
    auVar11[0xe] = uVar196;
    auVar19._8_4_ = 0;
    auVar19._0_8_ = uVar267;
    auVar19[0xc] = uVar258;
    auVar19._13_2_ = auVar11._13_2_;
    auVar27._8_4_ = 0;
    auVar27._0_8_ = uVar267;
    auVar27._12_3_ = auVar19._12_3_;
    auVar35._8_2_ = 0;
    auVar35._0_8_ = uVar267;
    auVar35[10] = uVar195;
    auVar35._11_4_ = auVar27._11_4_;
    auVar43._8_2_ = 0;
    auVar43._0_8_ = uVar267;
    auVar43._10_5_ = auVar35._10_5_;
    auVar51[8] = uVar243;
    auVar51._0_8_ = uVar267;
    auVar51._9_6_ = auVar43._9_6_;
    auVar108._7_8_ = 0;
    auVar108._0_7_ = auVar51._8_7_;
    Var109 = CONCAT81(SUB158(auVar108 << 0x40,7),uVar194);
    auVar125._9_6_ = 0;
    auVar125._0_9_ = Var109;
    auVar57[4] = uVar175;
    auVar57._0_4_ = auVar184._12_4_;
    auVar57._5_10_ = SUB1510(auVar125 << 0x30,5);
    auVar110._11_4_ = 0;
    auVar110._0_11_ = auVar57._4_11_;
    auVar63[2] = uVar174;
    auVar63._0_2_ = uVar280;
    auVar63._3_12_ = SUB1512(auVar110 << 0x20,3);
    auVar12[0xd] = 0;
    auVar12._0_13_ = auVar141._0_13_;
    auVar12[0xe] = uVar199;
    auVar20[0xc] = uVar259;
    auVar20._0_12_ = auVar141._0_12_;
    auVar20._13_2_ = auVar12._13_2_;
    auVar28[0xb] = 0;
    auVar28._0_11_ = auVar141._0_11_;
    auVar28._12_3_ = auVar20._12_3_;
    auVar36[10] = uVar198;
    auVar36._0_10_ = auVar141._0_10_;
    auVar36._11_4_ = auVar28._11_4_;
    auVar44[9] = 0;
    auVar44._0_9_ = auVar141._0_9_;
    auVar44._10_5_ = auVar36._10_5_;
    auVar52[8] = uVar244;
    auVar52._0_8_ = auVar141._0_8_;
    auVar52._9_6_ = auVar44._9_6_;
    auVar111._7_8_ = 0;
    auVar111._0_7_ = auVar52._8_7_;
    Var112 = CONCAT81(SUB158(auVar111 << 0x40,7),uVar197);
    auVar126._9_6_ = 0;
    auVar126._0_9_ = Var112;
    auVar58[4] = uVar177;
    auVar58._0_4_ = uVar136;
    auVar58._5_10_ = SUB1510(auVar126 << 0x30,5);
    auVar113._11_4_ = 0;
    auVar113._0_11_ = auVar58._4_11_;
    auVar64[2] = uVar176;
    auVar64._0_2_ = uVar135;
    auVar64._3_12_ = SUB1512(auVar113 << 0x20,3);
    sVar180 = (uVar150 & 0xff) + (uVar149 & 0xff);
    sVar193 = auVar62._2_2_ + auVar61._2_2_;
    sVar200 = auVar56._4_2_ + auVar104._0_2_;
    sVar319 = (short)Var103;
    sVar204 = (short)Var106 + sVar319;
    sVar205 = auVar50._8_2_ + auVar49._8_2_;
    sVar206 = auVar34._10_2_ + auVar33._10_2_;
    sVar207 = auVar18._12_2_ + auVar17._12_2_;
    uVar150 = auVar9._13_2_ >> 8;
    sVar208 = (auVar10._13_2_ >> 8) + uVar150;
    sVar257 = auVar60._2_2_;
    sVar260 = auVar101._0_2_;
    sVar262 = (short)Var100;
    sVar263 = auVar48._8_2_;
    sVar264 = auVar32._10_2_;
    sVar265 = auVar16._12_2_;
    uVar153 = auVar8._13_2_ >> 8;
    sVar209 = sVar180 * 2 + uVar155 + 4;
    sVar223 = sVar193 * 2 + sVar257 + 4;
    sVar224 = sVar200 * 2 + sVar260 + 4;
    sVar225 = sVar204 * 2 + sVar262 + 4;
    sVar226 = sVar205 * 2 + sVar263 + 4;
    sVar228 = sVar206 * 2 + sVar264 + 4;
    sVar229 = sVar207 * 2 + sVar265 + 4;
    sVar230 = sVar208 * 2 + uVar153 + 4;
    auVar13._8_6_ = 0;
    auVar13._0_8_ = auVar141._8_8_;
    auVar13[0xe] = uVar203;
    auVar21._8_4_ = 0;
    auVar21._0_8_ = auVar141._8_8_;
    auVar21[0xc] = uVar261;
    auVar21._13_2_ = auVar13._13_2_;
    auVar29._8_4_ = 0;
    auVar29._0_8_ = auVar141._8_8_;
    auVar29._12_3_ = auVar21._12_3_;
    auVar37._8_2_ = 0;
    auVar37._0_8_ = auVar141._8_8_;
    auVar37[10] = uVar202;
    auVar37._11_4_ = auVar29._11_4_;
    auVar45._8_2_ = 0;
    auVar45._0_8_ = auVar141._8_8_;
    auVar45._10_5_ = auVar37._10_5_;
    auVar53[8] = uVar245;
    auVar53._0_8_ = auVar141._8_8_;
    auVar53._9_6_ = auVar45._9_6_;
    auVar114._7_8_ = 0;
    auVar114._0_7_ = auVar53._8_7_;
    Var100 = CONCAT81(SUB158(auVar114 << 0x40,7),uVar201);
    auVar127._9_6_ = 0;
    auVar127._0_9_ = Var100;
    auVar59[4] = uVar179;
    auVar59._0_4_ = uVar151;
    auVar59._5_10_ = SUB1510(auVar127 << 0x30,5);
    auVar115._11_4_ = 0;
    auVar115._0_11_ = auVar59._4_11_;
    auVar65[2] = uVar178;
    auVar65._0_2_ = uVar231;
    auVar65._3_12_ = SUB1512(auVar115 << 0x20,3);
    sVar273 = (short)Var109;
    uVar291 = auVar11._13_2_ >> 8;
    uVar309 = (ushort)(uVar155 * 2 + (uVar280 & 0xff) + sVar209) >> 3;
    uVar311 = (ushort)(sVar257 * 2 + auVar63._2_2_ + sVar223) >> 3;
    uVar312 = (ushort)(sVar260 * 2 + auVar57._4_2_ + sVar224) >> 3;
    uVar313 = (ushort)(sVar262 * 2 + sVar273 + sVar225) >> 3;
    uVar314 = (ushort)(sVar263 * 2 + auVar51._8_2_ + sVar226) >> 3;
    uVar315 = (ushort)(sVar264 * 2 + auVar35._10_2_ + sVar228) >> 3;
    uVar316 = (ushort)(sVar265 * 2 + auVar19._12_2_ + sVar229) >> 3;
    uVar317 = (ushort)(uVar153 * 2 + uVar291 + sVar230) >> 3;
    sVar152 = (short)Var112;
    uVar154 = auVar12._13_2_ >> 8;
    uVar266 = (uVar280 & 0xff) * 2 + (uVar135 & 0xff) + sVar209;
    uVar271 = auVar63._2_2_ * 2 + auVar64._2_2_ + sVar223;
    uVar272 = auVar57._4_2_ * 2 + auVar58._4_2_ + sVar224;
    uVar274 = sVar273 * 2 + sVar152 + sVar225;
    uVar275 = auVar51._8_2_ * 2 + auVar52._8_2_ + sVar226;
    uVar276 = auVar35._10_2_ * 2 + auVar36._10_2_ + sVar228;
    uVar277 = auVar19._12_2_ * 2 + auVar20._12_2_ + sVar229;
    uVar278 = uVar291 * 2 + uVar154 + sVar230;
    uVar280 = uVar266 >> 3;
    uVar291 = uVar271 >> 3;
    uVar292 = uVar272 >> 3;
    uVar293 = uVar274 >> 3;
    uVar294 = uVar275 >> 3;
    uVar295 = uVar276 >> 3;
    uVar296 = uVar277 >> 3;
    uVar297 = uVar278 >> 3;
    auVar289[1] = (uVar291 != 0) * (uVar291 < 0x100) * (char)uVar291 - (0xff < uVar291);
    auVar289[0] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar289[2] = (uVar292 != 0) * (uVar292 < 0x100) * (char)uVar292 - (0xff < uVar292);
    auVar289[3] = (uVar293 != 0) * (uVar293 < 0x100) * (char)uVar293 - (0xff < uVar293);
    auVar289[4] = (uVar294 != 0) * (uVar294 < 0x100) * (char)uVar294 - (0xff < uVar294);
    auVar289[5] = (uVar295 != 0) * (uVar295 < 0x100) * (char)uVar295 - (0xff < uVar295);
    auVar289[6] = (uVar296 != 0) * (uVar296 < 0x100) * (char)uVar296 - (0xff < uVar296);
    auVar289[7] = (uVar297 != 0) * (uVar297 < 0x100) * (char)uVar297 - (0xff < uVar297);
    auVar289[8] = (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309);
    auVar289[9] = (uVar311 != 0) * (uVar311 < 0x100) * (char)uVar311 - (0xff < uVar311);
    auVar289[10] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
    auVar289[0xb] = (uVar313 != 0) * (uVar313 < 0x100) * (char)uVar313 - (0xff < uVar313);
    auVar289[0xc] = (uVar314 != 0) * (uVar314 < 0x100) * (char)uVar314 - (0xff < uVar314);
    auVar289[0xd] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
    auVar289[0xe] = (uVar316 != 0) * (uVar316 < 0x100) * (char)uVar316 - (0xff < uVar316);
    auVar289[0xf] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
    sVar209 = (short)Var100;
    uVar280 = auVar13._13_2_ >> 8;
    uVar266 = (((uVar135 & 0xff) + (uVar231 & 0xff)) - ((uVar149 & 0xff) + uVar155)) + uVar266;
    uVar271 = ((auVar64._2_2_ + auVar65._2_2_) - (auVar61._2_2_ + sVar257)) + uVar271;
    uVar272 = ((auVar58._4_2_ + auVar59._4_2_) - (auVar104._0_2_ + sVar260)) + uVar272;
    uVar274 = ((sVar152 + sVar209) - (sVar319 + sVar262)) + uVar274;
    uVar275 = ((auVar52._8_2_ + auVar53._8_2_) - (auVar49._8_2_ + sVar263)) + uVar275;
    uVar276 = ((auVar36._10_2_ + auVar37._10_2_) - (auVar33._10_2_ + sVar264)) + uVar276;
    uVar277 = ((auVar20._12_2_ + auVar21._12_2_) - (auVar17._12_2_ + sVar265)) + uVar277;
    uVar278 = ((uVar154 + uVar280) - (uVar150 + uVar153)) + uVar278;
    uVar135 = uVar266 >> 3;
    uVar149 = uVar271 >> 3;
    uVar150 = uVar272 >> 3;
    uVar153 = uVar274 >> 3;
    uVar291 = uVar275 >> 3;
    uVar154 = uVar276 >> 3;
    uVar155 = uVar277 >> 3;
    uVar292 = uVar278 >> 3;
    uVar231 = (ushort)(((uVar231 & 0xff) * 2 - sVar180) + uVar266) >> 3;
    uVar266 = (ushort)((auVar65._2_2_ * 2 - sVar193) + uVar271) >> 3;
    uVar271 = (ushort)((auVar59._4_2_ * 2 - sVar200) + uVar272) >> 3;
    uVar272 = (ushort)((sVar209 * 2 - sVar204) + uVar274) >> 3;
    uVar274 = (ushort)((auVar53._8_2_ * 2 - sVar205) + uVar275) >> 3;
    uVar275 = (ushort)((auVar37._10_2_ * 2 - sVar206) + uVar276) >> 3;
    uVar276 = (ushort)((auVar21._12_2_ * 2 - sVar207) + uVar277) >> 3;
    uVar280 = (ushort)((uVar280 * 2 - sVar208) + uVar278) >> 3;
    auVar143[1] = (uVar149 != 0) * (uVar149 < 0x100) * (char)uVar149 - (0xff < uVar149);
    auVar143[0] = (uVar135 != 0) * (uVar135 < 0x100) * (char)uVar135 - (0xff < uVar135);
    auVar143[2] = (uVar150 != 0) * (uVar150 < 0x100) * (char)uVar150 - (0xff < uVar150);
    auVar143[3] = (uVar153 != 0) * (uVar153 < 0x100) * (char)uVar153 - (0xff < uVar153);
    auVar143[4] = (uVar291 != 0) * (uVar291 < 0x100) * (char)uVar291 - (0xff < uVar291);
    auVar143[5] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
    auVar143[6] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar155 - (0xff < uVar155);
    auVar143[7] = (uVar292 != 0) * (uVar292 < 0x100) * (char)uVar292 - (0xff < uVar292);
    auVar143[8] = (uVar231 != 0) * (uVar231 < 0x100) * (char)uVar231 - (0xff < uVar231);
    auVar143[9] = (uVar266 != 0) * (uVar266 < 0x100) * (char)uVar266 - (0xff < uVar266);
    auVar143[10] = (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271);
    auVar143[0xb] = (uVar272 != 0) * (uVar272 < 0x100) * (char)uVar272 - (0xff < uVar272);
    auVar143[0xc] = (uVar274 != 0) * (uVar274 < 0x100) * (char)uVar274 - (0xff < uVar274);
    auVar143[0xd] = (uVar275 != 0) * (uVar275 < 0x100) * (char)uVar275 - (0xff < uVar275);
    auVar143[0xe] = (uVar276 != 0) * (uVar276 < 0x100) * (char)uVar276 - (0xff < uVar276);
    auVar143[0xf] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar310 = auVar143 & auVar301 | ~auVar301 & auVar310;
    auVar374 = auVar289 & auVar301 | ~auVar301 & auVar374;
  }
  bVar361 = auVar374[7];
  auVar14[0xd] = 0;
  auVar14._0_13_ = auVar374._0_13_;
  auVar14[0xe] = bVar361;
  auVar22[0xc] = auVar374[6];
  auVar22._0_12_ = auVar374._0_12_;
  auVar22._13_2_ = auVar14._13_2_;
  auVar30[0xb] = 0;
  auVar30._0_11_ = auVar374._0_11_;
  auVar30._12_3_ = auVar22._12_3_;
  auVar38[10] = auVar374[5];
  auVar38._0_10_ = auVar374._0_10_;
  auVar38._11_4_ = auVar30._11_4_;
  auVar46[9] = 0;
  auVar46._0_9_ = auVar374._0_9_;
  auVar46._10_5_ = auVar38._10_5_;
  auVar54[8] = auVar374[4];
  auVar54._0_8_ = auVar374._0_8_;
  auVar54._9_6_ = auVar46._9_6_;
  auVar116._7_8_ = 0;
  auVar116._0_7_ = auVar54._8_7_;
  Var100 = CONCAT81(SUB158(auVar116 << 0x40,7),auVar374[3]);
  auVar128._9_6_ = 0;
  auVar128._0_9_ = Var100;
  auVar117._1_10_ = SUB1510(auVar128 << 0x30,5);
  auVar117[0] = auVar374[2];
  auVar129._11_4_ = 0;
  auVar129._0_11_ = auVar117;
  auVar66[2] = auVar374[1];
  auVar66._0_2_ = auVar374._0_2_;
  auVar66._3_12_ = SUB1512(auVar129 << 0x20,3);
  bVar359 = auVar374[9];
  bVar373 = auVar374[10];
  bVar371 = auVar374[0xb];
  bVar369 = auVar374[0xc];
  bVar365 = auVar374[0xd];
  bVar367 = auVar374[0xe];
  bVar363 = auVar374[0xf];
  sVar152 = auVar54._8_2_;
  sVar180 = auVar38._10_2_;
  sVar193 = auVar22._12_2_;
  uVar280 = (ushort)Var100;
  uVar150 = auVar117._0_2_;
  uVar149 = auVar66._2_2_;
  uVar282 = CONCAT22(auVar374._0_2_,(ushort)auVar374[8]) & 0xffffff;
  uVar135 = (ushort)uVar282;
  uVar231 = (ushort)(uVar282 >> 0x10);
  uVar281 = CONCAT11((uVar231 != 0) * (uVar231 < 0x100) * auVar374[0] - (0xff < uVar231),
                     (uVar135 != 0) * (uVar135 < 0x100) * auVar374[8] - (0xff < uVar135));
  uVar151 = CONCAT13((uVar149 != 0) * (uVar149 < 0x100) * auVar374[1] - (0xff < uVar149),
                     CONCAT12((bVar359 != 0) * (bVar359 < 0x100) * bVar359 - (0xff < bVar359),
                              uVar281));
  uVar283 = CONCAT15((uVar150 != 0) * (uVar150 < 0x100) * auVar374[2] - (0xff < uVar150),
                     CONCAT14((bVar373 != 0) * (bVar373 < 0x100) * bVar373 - (0xff < bVar373),
                              uVar151));
  uVar284 = CONCAT17((uVar280 != 0) * (uVar280 < 0x100) * auVar374[3] - (0xff < uVar280),
                     CONCAT16((bVar371 != 0) * (bVar371 < 0x100) * bVar371 - (0xff < bVar371),
                              uVar283));
  auVar285._0_10_ =
       CONCAT19((0 < sVar152) * (sVar152 < 0x100) * auVar374[4] - (0xff < sVar152),
                CONCAT18((bVar369 != 0) * (bVar369 < 0x100) * bVar369 - (0xff < bVar369),uVar284));
  auVar285[10] = (bVar365 != 0) * (bVar365 < 0x100) * bVar365 - (0xff < bVar365);
  auVar285[0xb] = (0 < sVar180) * (sVar180 < 0x100) * auVar374[5] - (0xff < sVar180);
  auVar286[0xc] = (bVar367 != 0) * (bVar367 < 0x100) * bVar367 - (0xff < bVar367);
  auVar286._0_12_ = auVar285;
  auVar286[0xd] = (0 < sVar193) * (sVar193 < 0x100) * auVar374[6] - (0xff < sVar193);
  auVar290[0xe] = (bVar363 != 0) * (bVar363 < 0x100) * bVar363 - (0xff < bVar363);
  auVar290._0_14_ = auVar286;
  auVar290[0xf] = (bVar361 != 0) * (bVar361 < 0x100) * bVar361 - (0xff < bVar361);
  bVar361 = auVar310[8];
  bVar359 = auVar310[9];
  bVar373 = auVar310[10];
  bVar371 = auVar310[0xb];
  bVar369 = auVar310[0xc];
  bVar365 = auVar310[0xd];
  bVar367 = auVar310[0xe];
  bVar363 = auVar310[0xf];
  bVar298 = auVar310[7];
  auVar15[0xd] = 0;
  auVar15._0_13_ = auVar310._0_13_;
  auVar15[0xe] = bVar298;
  auVar23[0xc] = auVar310[6];
  auVar23._0_12_ = auVar310._0_12_;
  auVar23._13_2_ = auVar15._13_2_;
  auVar31[0xb] = 0;
  auVar31._0_11_ = auVar310._0_11_;
  auVar31._12_3_ = auVar23._12_3_;
  auVar39[10] = auVar310[5];
  auVar39._0_10_ = auVar310._0_10_;
  auVar39._11_4_ = auVar31._11_4_;
  auVar47[9] = 0;
  auVar47._0_9_ = auVar310._0_9_;
  auVar47._10_5_ = auVar39._10_5_;
  auVar55[8] = auVar310[4];
  auVar55._0_8_ = auVar310._0_8_;
  auVar55._9_6_ = auVar47._9_6_;
  auVar118._7_8_ = 0;
  auVar118._0_7_ = auVar55._8_7_;
  Var100 = CONCAT81(SUB158(auVar118 << 0x40,7),auVar310[3]);
  auVar130._9_6_ = 0;
  auVar130._0_9_ = Var100;
  auVar119._1_10_ = SUB1510(auVar130 << 0x30,5);
  auVar119[0] = auVar310[2];
  auVar131._11_4_ = 0;
  auVar131._0_11_ = auVar119;
  auVar67[2] = auVar310[1];
  auVar67._0_2_ = auVar310._0_2_;
  auVar67._3_12_ = SUB1512(auVar131 << 0x20,3);
  uVar135 = auVar310._0_2_ & 0xff;
  sVar152 = auVar55._8_2_;
  sVar180 = auVar39._10_2_;
  sVar193 = auVar23._12_2_;
  uVar150 = (ushort)Var100;
  uVar149 = auVar119._0_2_;
  uVar231 = auVar67._2_2_;
  uVar156 = CONCAT11((bVar361 != 0) * (bVar361 < 0x100) * bVar361 - (0xff < bVar361),
                     ((auVar310 & (undefined1  [16])0xff) != (undefined1  [16])0x0) *
                     (uVar135 < 0x100) * auVar310[0] - (0xff < uVar135));
  uVar136 = CONCAT13((bVar359 != 0) * (bVar359 < 0x100) * bVar359 - (0xff < bVar359),
                     CONCAT12((uVar231 != 0) * (uVar231 < 0x100) * auVar310[1] - (0xff < uVar231),
                              uVar156));
  uVar157 = CONCAT15((bVar373 != 0) * (bVar373 < 0x100) * bVar373 - (0xff < bVar373),
                     CONCAT14((uVar149 != 0) * (uVar149 < 0x100) * auVar310[2] - (0xff < uVar149),
                              uVar136));
  uVar158 = CONCAT17((bVar371 != 0) * (bVar371 < 0x100) * bVar371 - (0xff < bVar371),
                     CONCAT16((uVar150 != 0) * (uVar150 < 0x100) * auVar310[3] - (0xff < uVar150),
                              uVar157));
  auVar159._0_10_ =
       CONCAT19((bVar369 != 0) * (bVar369 < 0x100) * bVar369 - (0xff < bVar369),
                CONCAT18((0 < sVar152) * (sVar152 < 0x100) * auVar310[4] - (0xff < sVar152),uVar158)
               );
  auVar159[10] = (0 < sVar180) * (sVar180 < 0x100) * auVar310[5] - (0xff < sVar180);
  auVar159[0xb] = (bVar365 != 0) * (bVar365 < 0x100) * bVar365 - (0xff < bVar365);
  auVar160[0xc] = (0 < sVar193) * (sVar193 < 0x100) * auVar310[6] - (0xff < sVar193);
  auVar160._0_12_ = auVar159;
  auVar160[0xd] = (bVar367 != 0) * (bVar367 < 0x100) * bVar367 - (0xff < bVar367);
  auVar169[0xe] = (bVar298 != 0) * (bVar298 < 0x100) * bVar298 - (0xff < bVar298);
  auVar169._0_14_ = auVar160;
  auVar169[0xf] = (bVar363 != 0) * (bVar363 < 0x100) * bVar363 - (0xff < bVar363);
  auVar148._12_2_ = (short)((ulong)uVar284 >> 0x30);
  auVar148._0_12_ = auVar285;
  auVar148._14_2_ = (short)((ulong)uVar158 >> 0x30);
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._10_2_ = (short)((uint6)uVar157 >> 0x20);
  auVar147._0_10_ = auVar285._0_10_;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._8_2_ = (short)((uint6)uVar283 >> 0x20);
  auVar146._0_8_ = uVar284;
  auVar145._8_8_ = auVar146._8_8_;
  auVar145._6_2_ = (short)((uint)uVar136 >> 0x10);
  auVar145._0_6_ = uVar283;
  auVar144._6_10_ = auVar145._6_10_;
  auVar144._4_2_ = (short)((uint)uVar151 >> 0x10);
  auVar144._0_4_ = uVar151;
  *(uint *)(s + -2) = CONCAT22(uVar156,uVar281);
  *(int *)(s + lVar132 + -2) = auVar144._4_4_;
  *(int *)(s + lVar132 * 2 + -2) = auVar146._8_4_;
  *(undefined4 *)(s + lVar132 * 3 + -2) = auVar147._12_4_;
  *(short *)(s + lVar132 * 4 + -2) = (short)((unkuint10)auVar285._0_10_ >> 0x40);
  *(short *)(s + lVar132 * 4 + -2 + 2) = (short)((unkuint10)auVar159._0_10_ >> 0x40);
  *(short *)(s + lVar7 + 2) = auVar285._10_2_;
  *(short *)(s + lVar7 + 4) = auVar159._10_2_;
  *(short *)(s + lVar133 + 6) = auVar286._12_2_;
  *(short *)(s + lVar133 + 8) = auVar160._12_2_;
  *(short *)(s + lVar134 + 10) = auVar290._14_2_;
  *(short *)(s + lVar134 + 0xc) = auVar169._14_2_;
  return;
}

Assistant:

void aom_lpf_vertical_6_dual_sse2(uint8_t *s, int p, const uint8_t *_blimit0,
                                  const uint8_t *_limit0,
                                  const uint8_t *_thresh0,
                                  const uint8_t *_blimit1,
                                  const uint8_t *_limit1,
                                  const uint8_t *_thresh1) {
  __m128i blimit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_blimit0),
                                      _mm_load_si128((__m128i *)_blimit1));
  __m128i limit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_limit0),
                                     _mm_load_si128((__m128i *)_limit1));
  __m128i thresh = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_thresh0),
                                      _mm_load_si128((__m128i *)_thresh1));

  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i p0, q0;
  __m128i p1p0, q1q0;
  __m128i d0d1, d2d3, d4d5, d6d7;

  x0 = _mm_loadl_epi64((__m128i *)((s - 3) + 0 * p));
  x1 = _mm_loadl_epi64((__m128i *)((s - 3) + 1 * p));
  x2 = _mm_loadl_epi64((__m128i *)((s - 3) + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)((s - 3) + 3 * p));
  x4 = _mm_loadl_epi64((__m128i *)((s - 3) + 4 * p));
  x5 = _mm_loadl_epi64((__m128i *)((s - 3) + 5 * p));
  x6 = _mm_loadl_epi64((__m128i *)((s - 3) + 6 * p));
  x7 = _mm_loadl_epi64((__m128i *)((s - 3) + 7 * p));

  transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0d1, &d2d3, &d4d5,
                    &d6d7);

  d1 = _mm_srli_si128(d0d1, 8);
  d3 = _mm_srli_si128(d2d3, 8);
  d5 = _mm_srli_si128(d4d5, 8);
  d7 = _mm_srli_si128(d6d7, 8);

  lpf_internal_6_dual_sse2(&d0d1, &d5, &d1, &d4d5, &d2d3, &d3, &q1q0, &p1p0,
                           &blimit, &limit, &thresh);

  p0 = _mm_srli_si128(p1p0, 8);
  q0 = _mm_srli_si128(q1q0, 8);

  transpose4x8_8x4_sse2(&p0, &p1p0, &q1q0, &q0, &d0, &d1, &d2, &d3, &d4, &d5,
                        &d6, &d7);

  xx_storel_32((s - 2 + 0 * p), d0);
  xx_storel_32((s - 2 + 1 * p), d1);
  xx_storel_32((s - 2 + 2 * p), d2);
  xx_storel_32((s - 2 + 3 * p), d3);
  xx_storel_32((s - 2 + 4 * p), d4);
  xx_storel_32((s - 2 + 5 * p), d5);
  xx_storel_32((s - 2 + 6 * p), d6);
  xx_storel_32((s - 2 + 7 * p), d7);
}